

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# header.hpp
# Opt level: O2

void __thiscall CompoundFile::Header::load(Header *this,istream *stream)

{
  int iVar1;
  Exception *this_00;
  allocator local_59;
  char byteOrder [3];
  char fileID [9];
  
  fileID[8] = '\0';
  fileID[0] = '\0';
  fileID[1] = '\0';
  fileID[2] = '\0';
  fileID[3] = '\0';
  fileID[4] = '\0';
  fileID[5] = '\0';
  fileID[6] = '\0';
  fileID[7] = '\0';
  std::istream::read((char *)stream,(long)fileID);
  iVar1 = bcmp(cIdentifier,fileID,9);
  if (iVar1 == 0) {
    std::istream::seekg((long)stream,0x14);
    _byteOrder = _byteOrder & 0xff000000;
    std::istream::read((char *)stream,(long)byteOrder);
    iVar1 = bcmp(byteOrder,&cLittleEndian,3);
    this->m_byteOrder = (uint)(iVar1 == 0);
    _byteOrder = _byteOrder & 0xffff0000;
    readData<short>(stream,(short *)byteOrder,2);
    this->m_sectorSize = 1 << (byteOrder[0] & 0x1fU);
    _byteOrder = _byteOrder & 0xffff0000;
    readData<short>(stream,(short *)byteOrder,2);
    this->m_shortSectorSize = 1 << (byteOrder[0] & 0x1fU);
    std::istream::seekg((long)stream,10);
    _byteOrder = 0;
    readData<int>(stream,(int *)byteOrder,4);
    this->m_sectorsInSAT = _byteOrder;
    _byteOrder = 0;
    readData<int>(stream,(int *)byteOrder,4);
    (this->m_dirStreamSecID).m_id = _byteOrder;
    std::istream::seekg((long)stream,4);
    _byteOrder = 0;
    readData<int>(stream,(int *)byteOrder,4);
    this->m_streamMinSize = _byteOrder;
    _byteOrder = 0;
    readData<int>(stream,(int *)byteOrder,4);
    (this->m_ssatFirstSecID).m_id = _byteOrder;
    _byteOrder = 0;
    readData<int>(stream,(int *)byteOrder,4);
    this->m_sectorsInSSAT = _byteOrder;
    _byteOrder = 0;
    readData<int>(stream,(int *)byteOrder,4);
    (this->m_msatFirstSecID).m_id = _byteOrder;
    _byteOrder = 0;
    readData<int>(stream,(int *)byteOrder,4);
    this->m_sectorsInMSAT = _byteOrder;
    return;
  }
  this_00 = (Exception *)__cxa_allocate_exception(0x30);
  std::__cxx11::wstring::wstring
            ((wstring *)byteOrder,L"Wrong file identifier. It isn\'t a compound file.",&local_59);
  Exception::Exception(this_00,(wstring *)byteOrder);
  __cxa_throw(this_00,&Exception::typeinfo,Exception::~Exception);
}

Assistant:

inline void
Header::load( std::istream & stream )
{
	{
		char fileID[] =
			{ 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00 };

		stream.read( fileID, 8 );

		if( std::strcmp( cIdentifier, fileID ) != 0 )
			throw Exception( L"Wrong file identifier. "
				L"It isn't a compound file." );
	}

	stream.seekg( 20, std::ios::cur );

	{
		char byteOrder[] = { 0x00, 0x00, 0x00 };

		stream.read( byteOrder, 2 );

		if( std::strcmp( byteOrder, cLittleEndian ) == 0 )
			m_byteOrder = Excel::Stream::LittleEndian;
		else
			m_byteOrder = Excel::Stream::BigEndian;
	}

	{
		int16_t sectorSizePower = 0;

		readData( stream, sectorSizePower, 2 );

		m_sectorSize = 1 << sectorSizePower;
	}

	{
		int16_t shortSectorSizePower = 0;

		readData( stream, shortSectorSizePower, 2 );

		m_shortSectorSize = 1 << shortSectorSizePower;
	}

	stream.seekg( 10, std::ios::cur );

	{
		int32_t sectorsInSAT = 0;

		readData( stream, sectorsInSAT, 4 );

		m_sectorsInSAT = sectorsInSAT;
	}

	{
		int32_t dirStreamSecID = 0;

		readData( stream, dirStreamSecID, 4 );

		m_dirStreamSecID = dirStreamSecID;
	}

	stream.seekg( 4, std::ios::cur );

	{
		int32_t streamMinSize = 0;

		readData( stream, streamMinSize, 4 );

		m_streamMinSize = streamMinSize;
	}

	{
		int32_t ssatFirstSecID = 0;

		readData( stream, ssatFirstSecID, 4 );

		m_ssatFirstSecID = ssatFirstSecID;
	}

	{
		int32_t sectorsInSSAT = 0;

		readData( stream, sectorsInSSAT, 4 );

		m_sectorsInSSAT = sectorsInSSAT;
	}

	{
		int32_t msatFirstSecID = 0;

		readData( stream, msatFirstSecID, 4 );

		m_msatFirstSecID = msatFirstSecID;
	}

	{
		int32_t sectorsInMSAT = 0;

		readData( stream, sectorsInMSAT, 4 );

		m_sectorsInMSAT = sectorsInMSAT;
	}
}